

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

char * archive_librichacl_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_librichacl_version(void)
{
#if HAVE_LIBRICHACL
#if defined(LIBRICHACL_PKGCONFIG_VERSION)
	return LIBRICHACL_PKGCONFIG_VERSION;
#else
	return "system";
#endif
#else
	return NULL;
#endif
}